

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xtouch.c
# Opt level: O3

void touch_input_handle_begin
               (int id,double timestamp,float x,float y,_Bool primary,ALLEGRO_DISPLAY *disp)

{
  int i;
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  lVar1 = 0;
  do {
    if ((&touch_input_state.touches[0].id)[lVar2 * 2] < 0) {
      _al_event_source_lock(&touch_input.es);
      (&touch_input_state.touches[0].id)[lVar2 * 2] = (int)lVar1;
      (&touch_input_state.touches[0].x)[lVar2 * 2] = x;
      (&touch_input_state.touches[0].y)[lVar2 * 2] = y;
      *(undefined8 *)(&touch_input_state.touches[0].dx + lVar2 * 2) = 0;
      *(_Bool *)(lVar2 * 8 + 0x1e4c94) = primary;
      (&touch_input_state.touches[0].display)[lVar2] = disp;
      _al_event_source_unlock(&touch_input.es);
      generate_touch_input_event
                (0x32,timestamp,(&touch_input_state.touches[0].id)[lVar2 * 2],
                 (&touch_input_state.touches[0].x)[lVar2 * 2],
                 (&touch_input_state.touches[0].y)[lVar2 * 2],
                 (&touch_input_state.touches[0].dx)[lVar2 * 2],
                 (&touch_input_state.touches[0].dy)[lVar2 * 2],*(_Bool *)(lVar2 * 8 + 0x1e4c94),disp
                );
      *(int *)((long)touch_ids + lVar2) = id;
      return;
    }
    lVar1 = lVar1 + 1;
    lVar2 = lVar2 + 4;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

static void touch_input_handle_begin(int id, double timestamp, float x, float y, bool primary, ALLEGRO_DISPLAY *disp)
{
   int index= find_free_touch_state_index();
   if (index < 0)
       return;

   ALLEGRO_TOUCH_STATE* state = touch_input_state.touches + index;
   (void)primary;

   if (NULL == state)
      return;

   _al_event_source_lock(&touch_input.es);
   state->id      = index;
   state->x       = x;
   state->y       = y;
   state->dx      = 0.0f;
   state->dy      = 0.0f;
   state->primary = primary;
   state->display = disp;
   _al_event_source_unlock(&touch_input.es);

   generate_touch_input_event(ALLEGRO_EVENT_TOUCH_BEGIN, timestamp,
      state->id, state->x, state->y, state->dx, state->dy, state->primary,
      disp);

   touch_ids[index]= id;
}